

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

longlong __thiscall mkvparser::Block::GetTime(Block *this,Cluster *pCluster)

{
  long lVar1;
  longlong lVar2;
  longlong lVar3;
  
  lVar2 = GetTimeCode(this,pCluster);
  lVar1 = pCluster->m_pSegment->m_pInfo->m_timecodeScale;
  if ((lVar2 == 0) ||
     (lVar3 = -1,
     lVar1 <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar2),0))) {
    lVar3 = lVar1 * lVar2;
  }
  return lVar3;
}

Assistant:

long long Block::GetTime(const Cluster* pCluster) const {
  assert(pCluster);

  const long long tc = GetTimeCode(pCluster);

  const Segment* const pSegment = pCluster->m_pSegment;
  const SegmentInfo* const pInfo = pSegment->GetInfo();
  assert(pInfo);

  const long long scale = pInfo->GetTimeCodeScale();
  assert(scale >= 1);

  // Check if tc * scale could overflow.
  if (tc != 0 && scale > LLONG_MAX / tc) {
    return -1;
  }
  const long long ns = tc * scale;

  return ns;
}